

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall ncnn::Net::clear(Net *this)

{
  undefined1 uVar2;
  Layer *pLVar1;
  undefined3 uVar3;
  int iVar4;
  pointer ppLVar5;
  pointer ppLVar6;
  ulong uVar7;
  Option opt1;
  undefined4 local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::_M_erase_at_end
            (&this->blobs,
             (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
             super__Vector_impl_data._M_start);
  ppLVar5 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppLVar6 != ppLVar5) {
    uVar7 = 0;
    do {
      pLVar1 = ppLVar5[uVar7];
      local_28._0_1_ = (this->opt).use_int8_arithmetic;
      local_28._1_1_ = (this->opt).use_packing_layout;
      local_28._2_1_ = (this->opt).use_shader_pack8;
      local_28._3_1_ = (this->opt).use_image_storage;
      uVar2 = (this->opt).use_bf16_storage;
      uVar3 = *(undefined3 *)&(this->opt).field_0x25;
      local_28._4_4_ = CONCAT31(uVar3,uVar2);
      local_48 = *(undefined4 *)&this->opt;
      iStack_44 = (this->opt).num_threads;
      uStack_40 = *(undefined4 *)&(this->opt).blob_allocator;
      uStack_3c = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
      local_38 = *(undefined4 *)&(this->opt).workspace_allocator;
      uStack_34 = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
      uStack_30._0_1_ = (this->opt).use_winograd_convolution;
      uStack_30._1_1_ = (this->opt).use_sgemm_convolution;
      uStack_30._2_1_ = (this->opt).use_int8_inference;
      uStack_30._3_1_ = (this->opt).use_vulkan_compute;
      uStack_2c._0_1_ = (this->opt).use_fp16_packed;
      uStack_2c._1_1_ = (this->opt).use_fp16_storage;
      uStack_2c._2_1_ = (this->opt).use_fp16_arithmetic;
      uStack_2c._3_1_ = (this->opt).use_int8_storage;
      if (pLVar1->support_image_storage == false) {
        local_28._0_4_ = (uint)(uint3)local_28;
      }
      iVar4 = (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
      if (iVar4 != 0) {
        clear();
      }
      (*pLVar1->_vptr_Layer[1])(pLVar1);
      uVar7 = uVar7 + 1;
      ppLVar5 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar7 < (ulong)((long)ppLVar6 - (long)ppLVar5 >> 3));
  }
  if (ppLVar6 != ppLVar5) {
    (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar5;
  }
  return;
}

Assistant:

void Net::clear()
{
#if NCNN_VULKAN
    destroy_pipeline();
#endif // NCNN_VULKAN

    blobs.clear();
    for (size_t i=0; i<layers.size(); i++)
    {
        Layer* layer = layers[i];

        Option opt1 = opt;
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        delete layer;
    }
    layers.clear();

#if NCNN_VULKAN
    if (weight_vkallocator)
    {
        delete weight_vkallocator;
        weight_vkallocator = 0;
    }
    if (weight_staging_vkallocator)
    {
        delete weight_staging_vkallocator;
        weight_staging_vkallocator = 0;
    }
#endif // NCNN_VULKAN
}